

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_array_refcount.cpp
# Opt level: O0

array_deref_range * __thiscall
ir_array_refcount_visitor::get_array_deref(ir_array_refcount_visitor *this)

{
  uint uVar1;
  array_deref_range *paVar2;
  array_deref_range *d;
  void *ptr;
  ir_array_refcount_visitor *this_local;
  
  if ((ulong)this->derefs_size < (ulong)(this->num_derefs + 1) << 3) {
    paVar2 = (array_deref_range *)
             reralloc_size(this->mem_ctx,this->derefs,(ulong)(this->derefs_size + 0x1000));
    if (paVar2 == (array_deref_range *)0x0) {
      return (array_deref_range *)0x0;
    }
    this->derefs_size = this->derefs_size + 0x1000;
    this->derefs = paVar2;
  }
  uVar1 = this->num_derefs;
  this->num_derefs = this->num_derefs + 1;
  return this->derefs + uVar1;
}

Assistant:

array_deref_range *
ir_array_refcount_visitor::get_array_deref()
{
   if ((num_derefs + 1) * sizeof(array_deref_range) > derefs_size) {
      void *ptr = reralloc_size(mem_ctx, derefs, derefs_size + 4096);

      if (ptr == NULL)
         return NULL;

      derefs_size += 4096;
      derefs = (array_deref_range *)ptr;
   }

   array_deref_range *d = &derefs[num_derefs];
   num_derefs++;

   return d;
}